

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveIntegration.h
# Opt level: O1

void __thiscall libchess::Position::make_move(Position *this,Move move)

{
  pointer *ppSVar1;
  byte *pbVar2;
  pointer pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  iterator __position;
  pointer pSVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  char cVar14;
  byte bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  hash_type hVar21;
  uint uVar22;
  int iVar23;
  undefined1 *puVar24;
  undefined8 *puVar25;
  long lVar26;
  undefined7 uVar27;
  int iVar28;
  ulong uVar29;
  Bitboard square_bb;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  bool bVar33;
  undefined1 auStack_e20f [57599];
  undefined8 *puStack_110;
  undefined8 *apuStack_98 [2];
  undefined1 auStack_88 [12];
  undefined4 local_7c;
  ulong local_78;
  long local_70;
  State local_68;
  
  uVar17 = local_68._28_4_;
  uVar16 = local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
           super__Optional_payload_base<libchess::PieceType>._4_4_;
  puVar24 = auStack_88;
  iVar4 = (this->side_to_move_).super_MetaValueType<int>.value_;
  lVar32 = (long)iVar4;
  if (lVar32 == 1) {
    this->fullmoves_ = this->fullmoves_ + 1;
  }
  this->ply_ = this->ply_ + 1;
  local_68.castling_rights_.value_ = 0;
  local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square>._4_4_ =
       local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::Square>._4_4_ & 0xffffff00;
  local_68.previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Move>._M_engaged = false;
  local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType>._4_4_ =
       local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::PieceType>._4_4_ & 0xffffff00;
  local_68._28_4_ = local_68._28_4_ & 0xffffff00;
  local_68.hash_ = 0;
  local_68.pawn_hash_ = 0;
  local_68.halfmoves_ = 0;
  __position._M_current =
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->history_).
      super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    apuStack_98[1] = (undefined8 *)0x10de97;
    std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::
    _M_realloc_insert<libchess::Position::State>(&this->history_,__position,&local_68);
  }
  else {
    *(ulong *)&(__position._M_current)->halfmoves_ = (ulong)(uint)local_68._52_4_ << 0x20;
    (__position._M_current)->hash_ = 0;
    (__position._M_current)->pawn_hash_ = 0;
    *(ulong *)&((__position._M_current)->previous_move_).
               super__Optional_base<libchess::Move,_true,_true>._M_payload.
               super__Optional_payload_base<libchess::Move>._M_engaged =
         (ulong)(uint7)local_68._17_7_ << 8;
    *(ulong *)&((__position._M_current)->captured_pt_).
               super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
               super__Optional_payload_base<libchess::PieceType>._M_engaged =
         CONCAT44(uVar17,uVar16) & 0xffffff00ffffff00;
    ((__position._M_current)->castling_rights_).value_ = 0;
    ((__position._M_current)->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Square>._M_payload =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._M_payload;
    ((__position._M_current)->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Square>._M_engaged =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._M_engaged;
    *(undefined3 *)
     &((__position._M_current)->enpassant_square_).
      super__Optional_base<libchess::Square,_true,_true>._M_payload.
      super__Optional_payload_base<libchess::Square>.field_0x5 =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._5_3_;
    ((__position._M_current)->previous_move_).super__Optional_base<libchess::Move,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Move>._M_payload =
         local_68.previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Move>._M_payload;
    ppSVar1 = &(this->history_).
               super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  lVar19 = (long)this->ply_;
  pSVar8 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = pSVar8 + lVar19;
  pSVar8[lVar19].halfmoves_ = pSVar8[lVar19 + -1].halfmoves_ + 1;
  *(value_type *)
   &pSVar8[lVar19].previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
    super__Optional_payload_base<libchess::Move> = move.value_;
  if (*(bool *)((long)&pSVar8[lVar19].previous_move_.
                       super__Optional_base<libchess::Move,_true,_true>._M_payload + 4) == false) {
    *(bool *)((long)&(pSVar3->previous_move_).super__Optional_base<libchess::Move,_true,_true>.
                     _M_payload + 4) = true;
  }
  (pSVar3->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square> = (_Optional_payload_base<libchess::Square>)0x0;
  uVar22 = move.value_ & 0x3f;
  local_78 = (ulong)uVar22;
  uVar18 = (uint)move.value_ >> 6 & 0x3f;
  uVar20 = (ulong)uVar18;
  uVar29 = 1L << (sbyte)uVar22;
  (pSVar3->castling_rights_).value_ =
       castling_spoilers[local_78] & pSVar3[-1].castling_rights_.value_ & castling_spoilers[uVar20];
  lVar19 = 0;
  do {
    iVar5 = *(int *)((long)&constants::PIECE_TYPES + lVar19);
    uVar9 = this->piece_type_bb_[iVar5].value_;
    if ((uVar9 & uVar29) != 0) break;
    bVar33 = lVar19 != 0x14;
    lVar19 = lVar19 + 4;
  } while (bVar33);
  uVar30 = 1L << (sbyte)uVar18;
  lVar19 = 0;
  do {
    iVar6 = *(int *)((long)&constants::PIECE_TYPES + lVar19);
    if ((this->piece_type_bb_[iVar6].value_ & uVar30) != 0) {
      local_7c = 0x118101;
      goto LAB_0010df4b;
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x18);
  local_7c = 0;
LAB_0010df4b:
  uVar31 = (uint)move.value_ >> 0xc & 7;
  puVar25 = (undefined8 *)
            ((ulong)CONCAT31((uint3)((uint)move.value_ >> 0x17),(char)((uint)move.value_ >> 0xf)) &
            0xffffffffffffff07);
  if (((uint)move.value_ >> 0xf & 7) == 0) {
    lVar19 = 0;
    do {
      iVar28 = *(int *)((long)&constants::PIECE_TYPES + lVar19);
      uVar10 = this->piece_type_bb_[iVar28].value_;
      if ((uVar10 & uVar29) != 0) break;
      bVar33 = lVar19 != 0x14;
      lVar19 = lVar19 + 4;
    } while (bVar33);
    lVar19 = 0;
    do {
      uVar11 = this->piece_type_bb_[*(int *)((long)&constants::PIECE_TYPES + lVar19)].value_;
      lVar26 = lVar19;
      if ((uVar11 & uVar30) != 0) break;
      lVar26 = lVar19 + 4;
      bVar33 = lVar19 != 0x14;
      lVar19 = lVar26;
    } while (bVar33);
    local_70 = lVar32;
    if ((uVar31 == 0) || (uVar31 == 5)) {
      uVar27 = (undefined7)((ulong)lVar26 >> 8);
      puVar25 = (undefined8 *)CONCAT71(uVar27,6);
      if ((uVar11 & uVar30) == 0) {
        bVar33 = iVar28 != 0 || (uVar10 & uVar29) == 0;
        puVar25 = (undefined8 *)CONCAT71(uVar27,bVar33);
        if (bVar33) {
          if ((iVar28 != 5 || (uVar10 & uVar29) == 0) ||
             (puVar25 = (undefined8 *)CONCAT71(uVar27,2), ((uVar18 - uVar22) + 2 & 0xfffffffb) != 0)
             ) {
LAB_0010e1e1:
            puVar25 = (undefined8 *)CONCAT71((int7)((ulong)puVar25 >> 8),1);
          }
        }
        else {
          iVar23 = uVar18 - uVar22;
          iVar28 = -iVar23;
          if (0 < iVar23) {
            iVar28 = iVar23;
          }
          if ((iVar28 == 7) || (iVar28 == 9)) {
            puVar25 = (undefined8 *)CONCAT71(uVar27,3);
          }
          else {
            puVar25 = (undefined8 *)CONCAT71(uVar27,5);
            if (iVar28 != 0x10) goto LAB_0010e1e1;
          }
        }
      }
    }
    else {
      puVar25 = (undefined8 *)(ulong)((uint)((uVar11 & uVar30) != 0) * 3 + 4);
    }
  }
  if ((iVar5 == 0 && (uVar9 & uVar29) != 0) || ((char)local_7c != '\0')) {
    pSVar3->halfmoves_ = 0;
  }
  uVar7 = (&switchD_0010df98::switchdataD_00116080)[(ulong)puVar25 & 0xff];
  switch((ulong)puVar25 & 0xff) {
  case 0:
    break;
  case 1:
    this->piece_type_bb_[iVar5].value_ = this->piece_type_bb_[iVar5].value_ ^ uVar30 ^ uVar29;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ ^ uVar30 ^ uVar29;
    break;
  case 2:
    this->piece_type_bb_[5].value_ = this->piece_type_bb_[5].value_ ^ uVar30 ^ uVar29;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ ^ uVar30 ^ uVar29;
    if (uVar18 < 0x3a) {
      if (uVar18 == 2) {
        *(byte *)&this->piece_type_bb_[3].value_ = (byte)this->piece_type_bb_[3].value_ ^ 9;
        *(byte *)&this->color_bb_[lVar32].value_ = (byte)this->color_bb_[lVar32].value_ ^ 9;
      }
      else if (uVar18 == 6) {
        *(byte *)&this->piece_type_bb_[3].value_ = (byte)this->piece_type_bb_[3].value_ ^ 0xa0;
        *(byte *)&this->color_bb_[lVar32].value_ = (byte)this->color_bb_[lVar32].value_ ^ 0xa0;
      }
    }
    else if (uVar18 == 0x3a) {
      pbVar2 = (byte *)((long)&this->piece_type_bb_[3].value_ + 7);
      *pbVar2 = *pbVar2 ^ 9;
      pbVar2 = (byte *)((long)&this->color_bb_[lVar32].value_ + 7);
      *pbVar2 = *pbVar2 ^ 9;
    }
    else if (uVar18 == 0x3e) {
      pbVar2 = (byte *)((long)&this->piece_type_bb_[3].value_ + 7);
      *pbVar2 = *pbVar2 ^ 0xa0;
      pbVar2 = (byte *)((long)&this->color_bb_[lVar32].value_ + 7);
      *pbVar2 = *pbVar2 ^ 0xa0;
    }
    break;
  case 3:
    this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ ^ uVar30 ^ uVar29;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ ^ uVar30 ^ uVar29;
    bVar15 = ((iVar4 != 0) * '\x10' + (sbyte)uVar18) - 8U & 0x3f;
    uVar20 = -2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15;
    this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ & uVar20;
    this->color_bb_[iVar4 == 0].value_ = this->color_bb_[iVar4 == 0].value_ & uVar20;
    break;
  case 5:
    this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ ^ uVar30 ^ uVar29;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ ^ uVar30 ^ uVar29;
    *(uint *)&(pSVar3->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
              _M_payload.super__Optional_payload_base<libchess::Square> =
         (uint)(iVar4 == 0) * 0x10 + uVar22 + -8;
    if (*(bool *)((long)&(pSVar3->enpassant_square_).
                         super__Optional_base<libchess::Square,_true,_true>._M_payload + 4) == false
       ) {
      *(bool *)((long)&(pSVar3->enpassant_square_).
                       super__Optional_base<libchess::Square,_true,_true>._M_payload + 4) = true;
    }
    break;
  case 6:
    this->piece_type_bb_[iVar6].value_ = this->piece_type_bb_[iVar6].value_ & ~uVar30;
    this->color_bb_[iVar4 == 0].value_ = this->color_bb_[iVar4 == 0].value_ & ~uVar30;
    this->piece_type_bb_[iVar5].value_ = this->piece_type_bb_[iVar5].value_ ^ uVar29 ^ uVar30;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ ^ uVar29 ^ uVar30;
    break;
  case 7:
    this->piece_type_bb_[iVar6].value_ = this->piece_type_bb_[iVar6].value_ & ~uVar30;
    this->color_bb_[iVar4 == 0].value_ = this->color_bb_[iVar4 == 0].value_ & ~uVar30;
  case 4:
    this->piece_type_bb_[0].value_ = this->piece_type_bb_[0].value_ & ~uVar29;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ & ~uVar29;
    this->piece_type_bb_[uVar31].value_ = this->piece_type_bb_[uVar31].value_ | uVar30;
    this->color_bb_[lVar32].value_ = this->color_bb_[lVar32].value_ | uVar30;
    break;
  default:
    puStack_110 = apuStack_98 + 1;
    puVar12 = apuStack_98 + 1;
    cVar14 = '\x0f';
    puVar13 = puVar25;
    do {
      puVar13 = puVar13 + -1;
      puVar12 = puVar12 + -1;
      *puVar12 = *puVar13;
      cVar14 = cVar14 + -1;
    } while ('\0' < cVar14);
    puVar24 = auStack_e20f;
    out(0xc2,(short)uVar7 + 0x6080);
    apuStack_98[1] = puVar25;
    goto LAB_0010e54d;
  case 9:
    halt_baddata();
  case 10:
    halt_baddata();
  case 0xb:
switchD_0010df98_caseD_b:
    (*(code *)((long)&switchD_0010e539::switchdataD_001160a0 +
              (long)(int)(&switchD_0010e539::switchdataD_001160a0)[uVar20]))();
    return;
  case 0xc:
    uVar18 = (uint)move.value_ >> 6 & 7;
    uVar20 = (ulong)uVar18;
    if (uVar18 < 6) goto switchD_0010df98_caseD_b;
LAB_0010e54d:
    *(undefined8 *)(puVar24 + -8) = 0x10e558;
    std::__cxx11::string::push_back((char)this);
    return;
  }
  (pSVar3->captured_pt_).super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType> =
       (_Optional_payload_base<libchess::PieceType>)(CONCAT44(local_7c,iVar6) & 0xffffffffff);
  pSVar3->move_type_ = (Type)puVar25;
  (this->side_to_move_).super_MetaValueType<int>.value_ =
       (uint)((this->side_to_move_).super_MetaValueType<int>.value_ == 0);
  apuStack_98[1] = (undefined8 *)0x10e169;
  hVar21 = calculate_hash(this);
  pSVar3->hash_ = hVar21;
  apuStack_98[1] = (undefined8 *)0x10e175;
  hVar21 = calculate_pawn_hash(this);
  pSVar3->pawn_hash_ = hVar21;
  return;
}

Assistant:

inline void Position::make_move(Move move) {
    Color stm = side_to_move();
    if (stm == constants::BLACK) {
        ++fullmoves_;
    }
    ++ply_;
    history_.push_back(State{});
    State& prev_state = state_mut_ref(ply_ - 1);
    State& next_state = state_mut_ref();
    next_state.halfmoves_ = prev_state.halfmoves_ + 1;
    next_state.previous_move_ = move;
    next_state.enpassant_square_ = {};

    Square from_square = move.from_square();
    Square to_square = move.to_square();

    next_state.castling_rights_ = CastlingRights{prev_state.castling_rights_.value() &
                                                 castling_spoilers[from_square.value()] &
                                                 castling_spoilers[to_square.value()]};

    auto moving_pt = piece_type_on(from_square);
    auto captured_pt = piece_type_on(to_square);
    auto promotion_pt = move.promotion_piece_type();

    Move::Type move_type = move_type_of(move);

    if (moving_pt == constants::PAWN || captured_pt) {
        next_state.halfmoves_ = 0;
    }

    switch (move_type) {
    case Move::Type::NORMAL:
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::CAPTURE:
        remove_piece(to_square, *captured_pt, !stm);
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::DOUBLE_PUSH:
        move_piece(from_square, to_square, constants::PAWN, stm);
        next_state.enpassant_square_ =
            stm == constants::WHITE ? Square(from_square + 8) : Square(from_square - 8);
        break;
    case Move::Type::ENPASSANT:
        move_piece(from_square, to_square, constants::PAWN, stm);
        remove_piece(stm == constants::WHITE ? Square(to_square - 8) : Square(to_square + 8),
                     constants::PAWN, !stm);
        break;
    case Move::Type::CASTLING:
        move_piece(from_square, to_square, constants::KING, stm);
        switch (to_square) {
        case constants::C1:
            move_piece(constants::A1, constants::D1, constants::ROOK, stm);
            break;
        case constants::G1:
            move_piece(constants::H1, constants::F1, constants::ROOK, stm);
            break;
        case constants::C8:
            move_piece(constants::A8, constants::D8, constants::ROOK, stm);
            break;
        case constants::G8:
            move_piece(constants::H8, constants::F8, constants::ROOK, stm);
            break;
        default:
            break;
        }
        break;
    case Move::Type::PROMOTION:
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::CAPTURE_PROMOTION:
        remove_piece(to_square, *captured_pt, !stm);
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::NONE:
        break;
    }
    next_state.captured_pt_ = captured_pt;
    next_state.move_type_ = move_type;
    reverse_side_to_move();
    next_state.hash_ = calculate_hash();
    next_state.pawn_hash_ = calculate_pawn_hash();
}